

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O1

void __thiscall
cmUVProcessChain::InternalData::SpawnProcess
          (InternalData *this,size_t index,ProcessConfiguration *config,bool first,bool last)

{
  __uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
  data;
  pointer pbVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> arguments;
  array<uv_stdio_container_s,_3UL> stdio;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  uv_stdio_container_t local_b8;
  undefined8 local_a8;
  anon_union_8_2_26168aa3_for_data aStack_a0;
  undefined8 local_98;
  anon_union_8_2_26168aa3_for_data aStack_90;
  uv_process_options_t local_88;
  
  data._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>._M_head_impl =
       (this->Processes).
       super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[index]._M_t.
       super___uniq_ptr_impl<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
       ._M_t;
  local_88.cpumask = (char *)0x0;
  local_88.cpumask_size = 0;
  local_88.stdio = (uv_stdio_container_t *)0x0;
  local_88.uid = 0;
  local_88.gid = 0;
  local_88.cwd = (pointer)0x0;
  local_88.flags = 0;
  local_88.stdio_count = 0;
  local_88.args = (char **)0x0;
  local_88.env = (char **)0x0;
  local_88.exit_cb = (uv_exit_cb)0x0;
  pbVar3 = (config->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.file = (pbVar3->_M_dataplus)._M_p;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_d8,
             (long)(config->Arguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5);
  pbVar3 = (config->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (config->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_b8._0_8_ = (pbVar3->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_b8);
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  local_b8._0_8_ = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_d8,(char **)&local_b8);
  local_88.args =
       local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.flags = 0x90;
  if ((this->Builder->WorkingDirectory)._M_string_length != 0) {
    local_88.cwd = (this->Builder->WorkingDirectory)._M_dataplus._M_p;
  }
  if (first) {
    local_b8._0_8_ = *(undefined8 *)&(this->InputStreamData).Stdio;
    local_b8.data = (this->InputStreamData).Stdio.data;
  }
  else {
    local_b8.data.stream = (uv_stream_t *)0x0;
    local_b8._0_8_ = (char *)0x4;
    local_b8.data.stream =
         cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                   ((uv_pipe_ptr *)
                    ((long)data._M_t.
                           super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                           .
                           super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>
                           ._M_head_impl + 0x18));
  }
  if (last) {
    local_a8 = *(undefined8 *)&(this->OutputStreamData).Stdio;
    aStack_a0 = (this->OutputStreamData).Stdio.data;
  }
  else {
    aStack_a0 = (anon_union_8_2_26168aa3_for_data)0x0;
    local_a8 = 4;
    aStack_a0.stream =
         cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                   ((uv_pipe_ptr *)
                    ((long)data._M_t.
                           super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                           .
                           super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>
                           ._M_head_impl + 0x28));
  }
  local_98 = *(undefined8 *)&(this->ErrorStreamData).Stdio;
  aStack_90 = (this->ErrorStreamData).Stdio.data;
  local_88.stdio_count = 3;
  local_88.exit_cb = SpawnProcess::anon_class_1_0_00000001::__invoke;
  local_88.stdio = &local_b8;
  iVar2 = cm::uv_process_ptr::spawn
                    ((uv_process_ptr *)
                     ((long)data._M_t.
                            super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                            .
                            super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>
                            ._M_head_impl + 8),this->Loop,&local_88,
                     (void *)data._M_t.
                             super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                             .
                             super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>
                             ._M_head_impl);
  *(int *)((long)data._M_t.
                 super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                 .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
                 _M_head_impl + 0x38) = iVar2;
  if (iVar2 < 0) {
    *(undefined1 *)
     ((long)data._M_t.
            super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
            .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
            _M_head_impl + 0x3c) = 1;
    *(int *)(*(long *)data._M_t.
                      super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                      .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
                      _M_head_impl + 0x90) =
         *(int *)(*(long *)data._M_t.
                           super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                           .
                           super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>
                           ._M_head_impl + 0x90) + 1;
  }
  cm::uv_handle_ptr_base_<uv_pipe_s>::reset
            ((uv_handle_ptr_base_<uv_pipe_s> *)
             ((long)data._M_t.
                    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                    .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
                    _M_head_impl + 0x18));
  cm::uv_handle_ptr_base_<uv_pipe_s>::reset
            ((uv_handle_ptr_base_<uv_pipe_s> *)
             ((long)data._M_t.
                    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>
                    .super__Head_base<0UL,_cmUVProcessChain::InternalData::ProcessData_*,_false>.
                    _M_head_impl + 0x28));
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmUVProcessChain::InternalData::SpawnProcess(
  std::size_t index,
  const cmUVProcessChainBuilder::ProcessConfiguration& config, bool first,
  bool last)
{
  auto& process = *this->Processes[index];

  auto options = uv_process_options_t();

  // Bounds were checked at add time, first element is guaranteed to exist
  options.file = config.Arguments[0].c_str();

  std::vector<const char*> arguments;
  arguments.reserve(config.Arguments.size());
  for (auto const& arg : config.Arguments) {
    arguments.push_back(arg.c_str());
  }
  arguments.push_back(nullptr);
  options.args = const_cast<char**>(arguments.data());
  options.flags = UV_PROCESS_WINDOWS_HIDE;
#if UV_VERSION_MAJOR > 1 ||                                                   \
  (UV_VERSION_MAJOR == 1 && UV_VERSION_MINOR >= 48) ||                        \
  !defined(CMAKE_USE_SYSTEM_LIBUV)
  options.flags |= UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME;
#endif
  if (!this->Builder->WorkingDirectory.empty()) {
    options.cwd = this->Builder->WorkingDirectory.c_str();
  }

  std::array<uv_stdio_container_t, 3> stdio;
  if (first) {
    stdio[0] = this->InputStreamData.Stdio;
  } else {
    stdio[0] = uv_stdio_container_t();
    stdio[0].flags = UV_INHERIT_STREAM;
    stdio[0].data.stream = process.InputPipe;
  }
  if (last) {
    stdio[1] = this->OutputStreamData.Stdio;
  } else {
    stdio[1] = uv_stdio_container_t();
    stdio[1].flags = UV_INHERIT_STREAM;
    stdio[1].data.stream = process.OutputPipe;
  }
  stdio[2] = this->ErrorStreamData.Stdio;

  options.stdio = stdio.data();
  options.stdio_count = 3;
  options.exit_cb = [](uv_process_t* handle, int64_t exitStatus,
                       int termSignal) {
    auto* processData = static_cast<ProcessData*>(handle->data);
    processData->ProcessStatus.ExitStatus = exitStatus;
    processData->ProcessStatus.TermSignal = termSignal;
    processData->Finish();
  };

  if ((process.ProcessStatus.SpawnResult =
         process.Process.spawn(*this->Loop, options, &process)) < 0) {
    process.Finish();
  }
  process.InputPipe.reset();
  process.OutputPipe.reset();
}